

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool set_voice(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  long lVar4;
  char *in_RSI;
  uint *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000008;
  uint c_1;
  char name_extended [260];
  uint c;
  char temp [260];
  char *in_stack_000002f8;
  Open_JTalk *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  char local_238 [268];
  undefined4 local_12c;
  char local_128 [224];
  char *in_stack_ffffffffffffffb8;
  uint uVar5;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI == (uint *)0x0) {
    return false;
  }
  clear_path_string(in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
  if ((in_RSI == (char *)0x0) || (sVar2 = strlen(in_RSI), sVar2 == 0)) {
    uVar5 = (uint)((ulong)in_RSI >> 0x20);
    if ((in_RDI == (uint *)0xfffffffffffffef4) ||
       (sVar2 = strlen((char *)(in_RDI + 0x43)), sVar2 == 0)) {
      return false;
    }
    local_12c = 0;
    _Var1 = search_file_recursive
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                       uVar5);
    if (!_Var1) {
      local_12c = 0;
      _Var1 = search_file_recursive
                        (in_stack_00000008,unaff_retaddr,
                         (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_RDI,uVar5);
      if (!_Var1) {
        return false;
      }
    }
  }
  else {
    _Var1 = is_name_only(in_stack_000002f8);
    if (!_Var1) {
      _Var1 = is_relative(in_stack_ffffffffffffffb8);
      if (_Var1) {
        sVar2 = strlen(g_current_path);
        if (sVar2 != 0) {
          sVar2 = strlen(g_current_path);
          lVar4 = sVar2 + 1;
          sVar2 = strlen(in_RSI);
          if (0x104 < lVar4 + sVar2 + 1) {
            return false;
          }
          strcpy(local_128,g_current_path);
          strcat(local_128,G_SLASH_CHAR);
          strcat(local_128,in_RSI);
          _Var1 = exists_file((char *)in_stack_fffffffffffffda8);
          if (_Var1) goto LAB_0019259a;
        }
      }
      else {
        strcpy(local_128,in_RSI);
        _Var1 = exists_file((char *)in_stack_fffffffffffffda8);
        if (_Var1) goto LAB_0019259a;
      }
      return false;
    }
    sVar2 = strlen(in_RSI);
    sVar3 = strlen(G_VOICE_EXT);
    if (0x104 < sVar2 + sVar3 + 1) {
      return false;
    }
    __dest = strcpy(local_238,in_RSI);
    uVar5 = (uint)((ulong)in_RSI >> 0x20);
    strcat(__dest,G_VOICE_EXT);
    _Var1 = search_file_recursive
                      (in_stack_00000008,unaff_retaddr,
                       (char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                       uVar5);
    if (!_Var1) {
      return false;
    }
  }
LAB_0019259a:
  strcpy((char *)(in_RDI + 0x84),local_128);
  Open_JTalk_load_voice(in_stack_fffffffffffffda8,(char *)0x1925ce);
  return true;
}

Assistant:

bool set_voice(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// パスが指定されていないとき、
	if (path == NULL || strlen(path) == 0)
	{
		// 音響モデルファイルフォルダが確定されていれば
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			// 標準名の音響モデルファイルを探す
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_DEFAULT, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}

			// 無ければ、何か音響モデルファイルを探す
			c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_WILDCARD, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
		}

		// パスが指定されていないとき、決まらなければ、偽を返す
		return false;
	}
	// パスが指定されているとき
	else
	{
		// 名前のみの表記の場合、
		if (is_name_only(path))
		{
			if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
			{
				return false;
			}

			// dirが確定していれば
			char name_extended[MAX_PATH];
			strcat(strcpy(name_extended, path), G_VOICE_EXT);
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
			return false;
		}

		// 相対指定の場合、
		if (is_relative(path))
		{
			if (g_current_path != NULL && strlen(g_current_path) != 0)
			{
				if (strlen(g_current_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				strcpy(temp, g_current_path);
				strcat(temp, G_SLASH_CHAR);
				strcat(temp, path);

				if (exists_file(temp))
				{
					goto return_true;
				}
			}
		}
		// 絶対指定の場合、
		else
		{
			strcpy(temp, path);
			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->fn_voice_path, temp);
#if defined(_WIN32)
	char temp2[MAX_PATH];
	clear_path_string(temp2, MAX_PATH);
	u8tosjis_path(temp, temp2);
	Open_JTalk_load_voice(oj->open_jtalk, temp2);
#else
	Open_JTalk_load_voice(oj->open_jtalk, temp);
#endif
	return true;
}